

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O1

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::preprocess_subprograms
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Half dwversion,
          vector<cpptrace::detail::libdwarf::subprogram_entry,_std::allocator<cpptrace::detail::libdwarf::subprogram_entry>_>
          *vec)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(dwarf_resolver **)local_58._M_unused._0_8_ = this;
  *(die_object **)((long)local_58._M_unused._0_8_ + 8) = cu_die;
  *(Dwarf_Half *)((long)local_58._M_unused._0_8_ + 0x10) = dwversion;
  *(vector<cpptrace::detail::libdwarf::subprogram_entry,_std::allocator<cpptrace::detail::libdwarf::subprogram_entry>_>
    **)((long)local_58._M_unused._0_8_ + 0x18) = vec;
  pcStack_40 = std::
               _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:533:17)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:533:17)>
             ::_M_manager;
  walk_die_list(die,(function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void preprocess_subprograms(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Half dwversion,
            std::vector<subprogram_entry>& vec
        ) {
            walk_die_list(
                die,
                [this, &cu_die, dwversion, &vec] (const die_object& die) {
                    switch(die.get_tag()) {
                        case DW_TAG_subprogram:
                            {
                                auto ranges_vec = die.get_rangelist_entries(cu_die, dwversion);
                                // TODO: Feels super inefficient and some day should maybe use an interval tree.
                                for(auto range : ranges_vec) {
                                    // TODO: Reduce cloning here
                                    vec.push_back({ die.clone(), range.first, range.second });
                                }
                                // Walk children to get things like lambdas
                                // TODO: Somehow find a way to get better names here? For gcc it's just "operator()"
                                // On clang it's better
                                auto child = die.get_child();
                                if(child) {
                                    preprocess_subprograms(cu_die, child, dwversion, vec);
                                }
                            }
                            break;
                        case DW_TAG_namespace:
                        case DW_TAG_structure_type:
                        case DW_TAG_class_type:
                        case DW_TAG_module:
                        case DW_TAG_imported_module:
                        case DW_TAG_compile_unit:
                            {
                                auto child = die.get_child();
                                if(child) {
                                    preprocess_subprograms(cu_die, child, dwversion, vec);
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    return true;
                }
            );
            if(dump_dwarf) {
                std::fprintf(stderr, "End walk_die_list\n");
            }
        }